

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
               (ParseNode *pnodeScopeList,ParseNode *pnodeParent,
               ByteCodeGenerator *byteCodeGenerator,ParseNodeVisitor<ApplyCheck> prefix,
               ParseNodeVisitor<ApplyCheck> postfix,uint *pIndex,bool breakOnBodyScope)

{
  OpCode OVar1;
  uint index;
  NestedArray *pNVar2;
  NestedArray this;
  FuncInfo *pFVar3;
  Scope *innerScope;
  Scope *innerScope_00;
  ParseNode *pPVar4;
  FunctionInfo *nestedFunc;
  code *pcVar5;
  ParseNodeVisitor<ApplyCheck> postfix_00;
  ParseNodeVisitor<ApplyCheck> postfix_01;
  ParseNodeVisitor<ApplyCheck> postfix_02;
  ParseNodeVisitor<ApplyCheck> postfix_03;
  ParseNodeVisitor<ApplyCheck> postfix_04;
  ParseNodeVisitor<ApplyCheck> postfix_05;
  ParseNodeVisitor<ApplyCheck> postfix_06;
  ParseNodeVisitor<ApplyCheck> postfix_07;
  ParseNodeVisitor<ApplyCheck> postfix_08;
  anon_class_24_3_9710772a fn;
  anon_class_24_3_9710772a fn_00;
  ParseNodeVisitor<ApplyCheck> prefix_00;
  ParseNodeVisitor<ApplyCheck> prefix_01;
  ParseNodeVisitor<ApplyCheck> prefix_02;
  ParseNodeVisitor<ApplyCheck> prefix_03;
  ParseNodeVisitor<ApplyCheck> prefix_04;
  ParseNodeVisitor<ApplyCheck> prefix_05;
  ParseNodeVisitor<ApplyCheck> prefix_06;
  ParseNodeVisitor<ApplyCheck> prefix_07;
  ParseNodeVisitor<ApplyCheck> prefix_08;
  undefined4 *puVar6;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *p_Var7;
  bool bVar8;
  charcount_t cVar9;
  Type TVar10;
  uint uVar11;
  ParseNodeFnc *pPVar12;
  ParseNodeCatch *pnodeCatch;
  ParseNodeWith *pPVar13;
  FunctionBody *pFVar14;
  ParseNodeBlock *pPVar15;
  ParseNodeBin *pPVar16;
  FunctionProxy *pFVar17;
  Type TVar18;
  ParseableFunctionInfo *reuseNestedFunc;
  ParseNodePtr *ppPVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr **pp_Stack_98;
  bool isMergedScope;
  ParseNodeVisitor<ApplyCheck> *local_88;
  ParseNodeBlock *local_80;
  ParseableFunctionInfo *local_78;
  FuncInfo *local_70;
  undefined4 *local_68;
  uint *local_60;
  uint local_54;
  FunctionBody *pFStack_50;
  uint i;
  ApplyCheck *local_48;
  ParseNodeVisitor<ApplyCheck> prefix_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  prefix_local.m_context = (ApplyCheck *)prefix.m_fn;
  local_48 = prefix.m_context;
  local_60 = pIndex;
  prefix_local.m_fn =
       (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)byteCodeGenerator;
  pPVar12 = ParseNode::AsParseNodeFnc(pnodeParent);
  local_70 = pPVar12->funcInfo;
  local_78 = local_70->byteCodeFunction;
  local_54 = 0;
  pFStack_50 = byteCodeGenerator->pCurrentFunction;
  local_68 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if ((ParseNodeBlock *)pnodeScopeList == (ParseNodeBlock *)0x0) {
            return;
          }
          if ((breakOnBodyScope) &&
             (pPVar12 = ParseNode::AsParseNodeFnc(pnodeParent),
             (ParseNodeBlock *)pnodeScopeList == pPVar12->pnodeBodyScope)) {
            return;
          }
          OVar1 = (((ParseNodeBlock *)pnodeScopeList)->super_ParseNodeStmt).super_ParseNode.nop;
          if (OVar1 != knopCatch) break;
          pnodeCatch = ParseNode::AsParseNodeCatch(pnodeScopeList);
          PreVisitCatch(pnodeCatch,(ByteCodeGenerator *)prefix_local.m_fn);
          pPVar4 = pnodeCatch->pnodeParam;
          if ((pPVar4 != (ParseNode *)0x0) && (pPVar4->nop != knopParamPattern)) {
            prefix_01.m_fn =
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
                 prefix_local.m_context;
            prefix_01.m_context = local_48;
            postfix_00.m_fn = postfix.m_fn;
            postfix_00.m_context = postfix.m_context;
            Visit<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                      (pPVar4,(ByteCodeGenerator *)prefix_local.m_fn,prefix_01,postfix_00,
                       (ParseNode *)0x0);
          }
          pFVar3 = local_70;
          FuncInfo::OnStartVisitScope(local_70,pnodeCatch->scope,(bool *)&pp_Stack_98);
          prefix_02.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
               prefix_local.m_context;
          prefix_02.m_context = local_48;
          postfix_04.m_fn = postfix.m_fn;
          postfix_04.m_context = postfix.m_context;
          VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                    (pnodeCatch->pnodeScopes,pnodeParent,(ByteCodeGenerator *)prefix_local.m_fn,
                     prefix_02,postfix_04,local_60,false);
          FuncInfo::OnEndVisitScope(pFVar3,pnodeCatch->scope,pp_Stack_98._0_1_);
          PostVisitCatch((ParseNode *)pnodeCatch,(ByteCodeGenerator *)prefix_local.m_fn);
          pnodeScopeList = pnodeCatch->pnodeNext;
        }
        if (OVar1 != knopBlock) break;
        pPVar15 = ParseNode::AsParseNodeBlock(pnodeScopeList);
        PreVisitBlock(pPVar15,(ByteCodeGenerator *)prefix_local.m_fn);
        pFVar3 = local_70;
        FuncInfo::OnStartVisitScope(local_70,pPVar15->scope,(bool *)&pp_Stack_98);
        prefix_00.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)prefix_local.m_context
        ;
        prefix_00.m_context = local_48;
        postfix_03.m_fn = postfix.m_fn;
        postfix_03.m_context = postfix.m_context;
        VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                  (pPVar15->pnodeScopes,pnodeParent,(ByteCodeGenerator *)prefix_local.m_fn,prefix_00
                   ,postfix_03,local_60,false);
        FuncInfo::OnEndVisitScope(pFVar3,pPVar15->scope,pp_Stack_98._0_1_);
        PostVisitBlock(pPVar15,(ByteCodeGenerator *)prefix_local.m_fn);
        pPVar15 = ParseNode::AsParseNodeBlock(pnodeScopeList);
        pnodeScopeList = pPVar15->pnodeNext;
      }
      if (OVar1 != knopWith) break;
      PreVisitWith(pnodeScopeList,(ByteCodeGenerator *)prefix_local.m_fn);
      pPVar13 = ParseNode::AsParseNodeWith(pnodeScopeList);
      pFVar3 = local_70;
      FuncInfo::OnStartVisitScope(local_70,pPVar13->scope,(bool *)&pp_Stack_98);
      pPVar13 = ParseNode::AsParseNodeWith(pnodeScopeList);
      prefix_03.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)prefix_local.m_context;
      prefix_03.m_context = local_48;
      postfix_05.m_fn = postfix.m_fn;
      postfix_05.m_context = postfix.m_context;
      VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                (pPVar13->pnodeScopes,pnodeParent,(ByteCodeGenerator *)prefix_local.m_fn,prefix_03,
                 postfix_05,local_60,false);
      pPVar13 = ParseNode::AsParseNodeWith(pnodeScopeList);
      FuncInfo::OnEndVisitScope(pFVar3,pPVar13->scope,pp_Stack_98._0_1_);
      ByteCodeGenerator::PopScope((ByteCodeGenerator *)prefix_local.m_fn);
      pPVar13 = ParseNode::AsParseNodeWith(pnodeScopeList);
      pnodeScopeList = pPVar13->pnodeNext;
    }
    if (OVar1 != knopFncDecl) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = local_68;
      *local_68 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xdd5,"(false)","Unexpected opcode in tree of scopes");
      if (bVar8) {
        *puVar6 = 0;
        return;
      }
      goto LAB_0078bded;
    }
    pPVar12 = ParseNode::AsParseNodeFnc(pnodeScopeList);
    if (pFStack_50 != (FunctionBody *)0x0) {
      bVar8 = ByteCodeGenerator::IsInNonDebugMode((ByteCodeGenerator *)prefix_local.m_fn);
      if (bVar8) {
        if (((local_78->super_FunctionProxy).field_0x46 & 0x10) == 0) {
LAB_0078b864:
          pFVar14 = (FunctionBody *)0x0;
LAB_0078b866:
          *(FunctionBody **)(prefix_local.m_fn + 0x1c8) = pFVar14;
        }
      }
      else if ((((local_78->super_FunctionProxy).field_0x46 & 0x10) == 0) ==
               (((pFStack_50->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 0x10) ==
               0)) {
        cVar9 = Js::ParseableFunctionInfo::StartInDocument(&pFStack_50->super_ParseableFunctionInfo)
        ;
        if (cVar9 != pnodeParent->ichMin) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = local_68;
          *local_68 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xd07,"(pLastReuseFunc->StartInDocument() == pnodeParent->ichMin)",
                             "pLastReuseFunc->StartInDocument() == pnodeParent->ichMin");
          if (!bVar8) goto LAB_0078bded;
          *puVar6 = 0;
          cVar9 = pnodeParent->ichMin;
        }
        if ((pFStack_50->super_ParseableFunctionInfo).m_cchLength != pnodeParent->ichLim - cVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = local_68;
          *local_68 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xd08,
                             "(pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints())"
                             ,"pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints()"
                            );
          if (!bVar8) goto LAB_0078bded;
          *puVar6 = 0;
        }
        pNVar2 = (pFStack_50->super_ParseableFunctionInfo).nestedArray.ptr;
        TVar10 = 0;
        TVar18 = 0;
        if (pNVar2 != (NestedArray *)0x0) {
          TVar18 = pNVar2->nestedCount;
        }
        pNVar2 = (local_78->nestedArray).ptr;
        if (pNVar2 != (NestedArray *)0x0) {
          TVar10 = pNVar2->nestedCount;
        }
        if (TVar18 != TVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = local_68;
          *local_68 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xd09,
                             "(pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount())",
                             "pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount()");
          if (!bVar8) goto LAB_0078bded;
          *puVar6 = 0;
        }
        pFVar17 = Js::ParseableFunctionInfo::GetNestedFunctionProxy
                            (&pFStack_50->super_ParseableFunctionInfo,*local_60);
        if ((pFVar17 == (FunctionProxy *)0x0) ||
           (bVar8 = Js::FunctionProxy::IsFunctionBody(pFVar17), !bVar8)) goto LAB_0078b864;
        pFVar14 = Js::FunctionProxy::GetFunctionBody(pFVar17);
        goto LAB_0078b866;
      }
    }
    pNVar2 = (local_78->nestedArray).ptr;
    if (pNVar2 == (NestedArray *)0x0) {
LAB_0078b941:
      reuseNestedFunc = (ParseableFunctionInfo *)0x0;
    }
    else {
      uVar11 = *local_60;
      if (pNVar2->nestedCount <= uVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = local_68;
        *local_68 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xd23,"(*pIndex < parentNestedArray->nestedCount)",
                           "*pIndex < parentNestedArray->nestedCount");
        if (!bVar8) goto LAB_0078bded;
        *puVar6 = 0;
        uVar11 = *local_60;
      }
      this = pNVar2[(ulong)uVar11 + 1];
      if ((this == (NestedArray)0x0) || (((Type *)((long)this + 8))->ptr == (FunctionProxy *)0x0))
      goto LAB_0078b941;
      reuseNestedFunc = (ParseableFunctionInfo *)0x0;
      if ((*(Type *)((long)this + 0x18) & DeferredDeserialize) == None) {
        reuseNestedFunc = Js::FunctionInfo::GetParseableFunctionInfo((FunctionInfo *)this);
        bVar8 = ByteCodeGenerator::IsInNonDebugMode((ByteCodeGenerator *)prefix_local.m_fn);
        if (((!bVar8) && (*(long *)(prefix_local.m_fn + 0x1c8) == 0)) &&
           (bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy), bVar8)
           ) {
          pFVar14 = Js::FunctionProxy::GetFunctionBody(&reuseNestedFunc->super_FunctionProxy);
          *(FunctionBody **)(prefix_local.m_fn + 0x1c8) = pFVar14;
        }
      }
    }
    PreVisitFunction(pPVar12,(ByteCodeGenerator *)prefix_local.m_fn,reuseNestedFunc);
    pFVar3 = pPVar12->funcInfo;
    FuncInfo::OnStartVisitFunction(local_70,pPVar12);
    if (pPVar12->pnodeBody == (ParseNodePtr)0x0) {
LAB_0078bcc1:
      ByteCodeGenerator::PushScope((ByteCodeGenerator *)prefix_local.m_fn,pFVar3->paramScope);
      ByteCodeGenerator::PushScope((ByteCodeGenerator *)prefix_local.m_fn,pFVar3->bodyScope);
    }
    else {
      bVar8 = ByteCodeGenerator::IsInNonDebugMode((ByteCodeGenerator *)prefix_local.m_fn);
      if (((pFStack_50 != (FunctionBody *)0x0) && (!bVar8)) &&
         ((*(long *)(prefix_local.m_fn + 0x1c8) == 0 &&
          ((pFVar17 = Js::ParseableFunctionInfo::GetNestedFunctionProxy
                                (&pFStack_50->super_ParseableFunctionInfo,*local_60),
           pFVar17 != (FunctionProxy *)0x0 &&
           (bVar8 = Js::FunctionProxy::IsFunctionBody(pFVar17), !bVar8)))))) {
        pFVar14 = Js::FunctionProxy::GetFunctionBody(&pFVar3->byteCodeFunction->super_FunctionProxy)
        ;
        Js::FunctionProxy::UpdateFunctionBodyImpl(pFVar17,pFVar14);
      }
      innerScope = pFVar3->paramScope;
      innerScope_00 = pFVar3->bodyScope;
      BeginVisitBlock(pPVar12->pnodeScopes,(ByteCodeGenerator *)prefix_local.m_fn);
      local_54 = 0;
      local_80 = pPVar12->pnodeScopes;
      ByteCodeGenerator::PushScope((ByteCodeGenerator *)prefix_local.m_fn,innerScope);
      uVar20 = SUB84(&postfix,0);
      uVar21 = (undefined4)((ulong)&postfix >> 0x20);
      if (((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) != kFunctionNone) &&
         ((pFVar3->field_0xb5 & 0x80) == 0)) {
        pFVar3->currentChildScope = innerScope;
        if (((local_80->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) ||
           (pPVar15 = ParseNode::AsParseNodeBlock((ParseNode *)local_80),
           (~pPVar15->field_0x5c & 3) != 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = local_68;
          *local_68 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xd54,
                             "(containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter)"
                             ,
                             "containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter"
                            );
          if (!bVar8) goto LAB_0078bded;
          *puVar6 = 0;
        }
        pPVar15 = ParseNode::AsParseNodeBlock((ParseNode *)local_80);
        prefix_04.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)prefix_local.m_context
        ;
        prefix_04.m_context = local_48;
        postfix_06.m_fn = postfix.m_fn;
        postfix_06.m_context = postfix.m_context;
        VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                  (pPVar15->pnodeScopes,&pPVar12->super_ParseNode,
                   (ByteCodeGenerator *)prefix_local.m_fn,prefix_04,postfix_06,&local_54,true);
        pp_Stack_98 = &prefix_local.m_fn;
        _isMergedScope = &local_48;
        fn.prefix = (ParseNodeVisitor<ApplyCheck> *)_isMergedScope;
        fn.byteCodeGenerator = (ByteCodeGenerator **)pp_Stack_98;
        fn.postfix._0_4_ = uVar20;
        fn.postfix._4_4_ = uVar21;
        local_88 = &postfix;
        MapFormalsImpl<VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>(ParseNode*,ParseNode*,ByteCodeGenerator*,ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>,unsigned_int*,bool)::_lambda(ParseNode*)_1_,true>
                  (pPVar12,fn);
      }
      ByteCodeGenerator::PushScope((ByteCodeGenerator *)prefix_local.m_fn,innerScope_00);
      pFVar3->currentChildScope = innerScope_00;
      PreVisitBlock(pPVar12->pnodeBodyScope,(ByteCodeGenerator *)prefix_local.m_fn);
      AddVarsToScope(pPVar12->pnodeVars,(ByteCodeGenerator *)prefix_local.m_fn);
      if (((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone) ||
         ((pFVar3->field_0xb5 & 0x80) != 0)) {
        prefix_05.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)prefix_local.m_context
        ;
        prefix_05.m_context = local_48;
        postfix_07.m_fn = postfix.m_fn;
        postfix_07.m_context = postfix.m_context;
        VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                  ((ParseNode *)local_80,&pPVar12->super_ParseNode,
                   (ByteCodeGenerator *)prefix_local.m_fn,prefix_05,postfix_07,&local_54,false);
        pp_Stack_98 = &prefix_local.m_fn;
        _isMergedScope = &local_48;
        fn_00.prefix = (ParseNodeVisitor<ApplyCheck> *)_isMergedScope;
        fn_00.byteCodeGenerator = (ByteCodeGenerator **)pp_Stack_98;
        fn_00.postfix._0_4_ = uVar20;
        fn_00.postfix._4_4_ = uVar21;
        local_88 = &postfix;
        MapFormalsImpl<VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>(ParseNode*,ParseNode*,ByteCodeGenerator*,ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>,unsigned_int*,bool)::_lambda(ParseNode*)_2_,true>
                  (pPVar12,fn_00);
        if ((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) != kFunctionNone)
        goto LAB_0078bb55;
      }
      else {
LAB_0078bb55:
        ByteCodeGenerator::AssignUndefinedConstRegister((ByteCodeGenerator *)prefix_local.m_fn);
        if ((pFVar3->field_0xb5 & 0x80) == 0) {
          pPVar15 = pPVar12->pnodeBodyScope;
          if (pPVar15->scope == (Scope *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = local_68;
            *local_68 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xd6c,"(pnodeFnc->pnodeBodyScope->scope)",
                               "pnodeFnc->pnodeBodyScope->scope");
            if (!bVar8) {
LAB_0078bded:
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar6 = 0;
            pPVar15 = pPVar12->pnodeBodyScope;
          }
          prefix_06.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
               prefix_local.m_context;
          prefix_06.m_context = local_48;
          postfix_08.m_fn = postfix.m_fn;
          postfix_08.m_context = postfix.m_context;
          VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                    (pPVar15->pnodeScopes,&pPVar12->super_ParseNode,
                     (ByteCodeGenerator *)prefix_local.m_fn,prefix_06,postfix_08,&local_54,false);
        }
      }
      BeginVisitBlock(pPVar12->pnodeBodyScope,(ByteCodeGenerator *)prefix_local.m_fn);
      ppPVar19 = &pPVar12->pnodeBody;
      while (p_Var7 = prefix_local.m_fn, pPVar4 = *ppPVar19, pPVar4->nop == knopList) {
        pPVar16 = ParseNode::AsParseNodeBin(pPVar4);
        *(ParseNodePtr *)(p_Var7 + 0x28) = pPVar16->pnode1;
        pPVar16 = ParseNode::AsParseNodeBin(pPVar4);
        prefix_07.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)prefix_local.m_context
        ;
        prefix_07.m_context = local_48;
        postfix_01.m_fn = postfix.m_fn;
        postfix_01.m_context = postfix.m_context;
        Visit<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                  (pPVar16->pnode1,(ByteCodeGenerator *)prefix_local.m_fn,prefix_07,postfix_01,
                   (ParseNode *)0x0);
        if (((pFVar3->field_0xb4 & 6) == 0) &&
           (bVar8 = ByteCodeGenerator::ShouldTrackDebuggerMetadata
                              ((ByteCodeGenerator *)prefix_local.m_fn), !bVar8)) {
          pPVar16 = ParseNode::AsParseNodeBin(pPVar4);
          MarkInit(pPVar16->pnode1);
        }
        pPVar16 = ParseNode::AsParseNodeBin(pPVar4);
        ppPVar19 = &pPVar16->pnode2;
      }
      *(ParseNode **)(prefix_local.m_fn + 0x28) = pPVar4;
      prefix_08.m_fn =
           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)prefix_local.m_context;
      prefix_08.m_context = local_48;
      postfix_02.m_fn = postfix.m_fn;
      postfix_02.m_context = postfix.m_context;
      Visit<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                (pPVar4,(ByteCodeGenerator *)prefix_local.m_fn,prefix_08,postfix_02,(ParseNode *)0x0
                );
      EndVisitBlock(pPVar12->pnodeBodyScope,(ByteCodeGenerator *)prefix_local.m_fn);
      EndVisitBlock(pPVar12->pnodeScopes,(ByteCodeGenerator *)prefix_local.m_fn);
      if (pPVar12->pnodeBody == (ParseNodePtr)0x0) goto LAB_0078bcc1;
    }
    bVar8 = FuncInfo::IsFakeGlobalFunction(local_70,*(uint32 *)(prefix_local.m_fn + 0x10));
    if (!bVar8) {
      index = *local_60;
      pPVar12->nestedIndex = index;
      nestedFunc = (pFVar3->byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
      *local_60 = index + 1;
      Js::ParseableFunctionInfo::SetNestedFunc
                (local_78,nestedFunc,index,*(uint32 *)(prefix_local.m_fn + 0x10));
    }
    FuncInfo::OnEndVisitFunction(local_70,pPVar12);
    PostVisitFunction(pPVar12,(ByteCodeGenerator *)prefix_local.m_fn);
    pnodeScopeList = pPVar12->pnodeNext;
    *(FunctionBody **)(prefix_local.m_fn + 0x1c8) = pFStack_50;
  } while( true );
}

Assistant:

void VisitNestedScopes(ParseNode* pnodeScopeList, ParseNode* pnodeParent, ByteCodeGenerator* byteCodeGenerator,
    PrefixFn prefix, PostfixFn postfix, uint *pIndex, bool breakOnBodyScope = false)
{
    // Visit all scopes nested in this scope before visiting this function's statements. This way we have all the
    // attributes of all the inner functions before we assign registers within this function.
    // All the attributes we need to propagate downward should already be recorded by the parser.
    // - call to "eval()"
    // - nested in "with"
    FuncInfo * parentFuncInfo = pnodeParent->AsParseNodeFnc()->funcInfo;
    Js::ParseableFunctionInfo* parentFunc = parentFuncInfo->byteCodeFunction;
    ParseNode* pnodeScope;
    uint i = 0;

    // Cache to restore it back once we come out of current function.
    Js::FunctionBody * pLastReuseFunc = byteCodeGenerator->pCurrentFunction;

    for (pnodeScope = pnodeScopeList; pnodeScope;)
    {
        if (breakOnBodyScope && pnodeScope == pnodeParent->AsParseNodeFnc()->pnodeBodyScope)
        {
            break;
        }

        switch (pnodeScope->nop)
        {
        case knopFncDecl:
        {
            ParseNodeFnc * pnodeFnc = pnodeScope->AsParseNodeFnc();
            if (pLastReuseFunc)
            {
                if (!byteCodeGenerator->IsInNonDebugMode())
                {
                    // Here we are trying to match the inner sub-tree as well with already created inner function.

                    if ((pLastReuseFunc->GetIsGlobalFunc() && parentFunc->GetIsGlobalFunc())
                        || (!pLastReuseFunc->GetIsGlobalFunc() && !parentFunc->GetIsGlobalFunc()))
                    {
                        Assert(pLastReuseFunc->StartInDocument() == pnodeParent->ichMin);
                        Assert(pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints());
                        Assert(pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount());

                        // If the current function is not parsed yet, its function body is not generated yet.
                        // Reset pCurrentFunction to null so that it will not be able re-use anything.
                        Js::FunctionProxy* proxy = pLastReuseFunc->GetNestedFunctionProxy((*pIndex));
                        if (proxy && proxy->IsFunctionBody())
                        {
                            byteCodeGenerator->pCurrentFunction = proxy->GetFunctionBody();
                        }
                        else
                        {
                            byteCodeGenerator->pCurrentFunction = nullptr;
                        }
                    }
                }
                else if (!parentFunc->GetIsGlobalFunc())
                {
                    // In the deferred parsing mode, we will be reusing the only one function (which is asked when on ::Begin) all inner function will be created.
                    byteCodeGenerator->pCurrentFunction = nullptr;
                }
            }

            Js::ParseableFunctionInfo::NestedArray * parentNestedArray = parentFunc->GetNestedArray();
            Js::ParseableFunctionInfo* reuseNestedFunc = nullptr;
            if (parentNestedArray)
            {
                Assert(*pIndex < parentNestedArray->nestedCount);
                Js::FunctionInfo * info = parentNestedArray->functionInfoArray[*pIndex];
                if (info && info->HasParseableInfo())
                {
                    reuseNestedFunc = info->GetParseableFunctionInfo();

                    // If parentFunc was redeferred, try to set pCurrentFunction to this FunctionBody,
                    // and cleanup to reparse (as previous cleanup stops at redeferred parentFunc).
                    if (!byteCodeGenerator->IsInNonDebugMode()
                        && !byteCodeGenerator->pCurrentFunction
                        && reuseNestedFunc->IsFunctionBody())
                    {
                        byteCodeGenerator->pCurrentFunction = reuseNestedFunc->GetFunctionBody();
                    }
                }
            }
            PreVisitFunction(pnodeFnc, byteCodeGenerator, reuseNestedFunc);
            FuncInfo *funcInfo = pnodeFnc->funcInfo;

            parentFuncInfo->OnStartVisitFunction(pnodeFnc);

            if (pnodeFnc->pnodeBody)
            {
                if (!byteCodeGenerator->IsInNonDebugMode() && pLastReuseFunc != nullptr && byteCodeGenerator->pCurrentFunction == nullptr)
                {
                    // Patch current non-parsed function's FunctionBodyImpl with the new generated function body.
                    // So that the function object (pointing to the old function body) can able to get to the new one.

                    Js::FunctionProxy* proxy = pLastReuseFunc->GetNestedFunctionProxy((*pIndex));
                    if (proxy && !proxy->IsFunctionBody())
                    {
                        proxy->UpdateFunctionBodyImpl(funcInfo->byteCodeFunction->GetFunctionBody());
                    }
                }

                Scope *paramScope = funcInfo->GetParamScope();
                Scope *bodyScope = funcInfo->GetBodyScope();

                BeginVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
                i = 0;
                ParseNodePtr containerScope = pnodeFnc->pnodeScopes;

                // Push the param scope
                byteCodeGenerator->PushScope(paramScope);

                if (pnodeFnc->HasNonSimpleParameterList() && !funcInfo->IsBodyAndParamScopeMerged())
                {
                    // Set param scope as the current child scope.
                    funcInfo->SetCurrentChildScope(paramScope);
                    Assert(containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter);
                    VisitNestedScopes(containerScope->AsParseNodeBlock()->pnodeScopes, pnodeFnc, byteCodeGenerator, prefix, postfix, &i, true);
                    MapFormals(pnodeFnc, [&](ParseNode *argNode) { Visit(argNode, byteCodeGenerator, prefix, postfix); });
                }

                // Push the body scope
                byteCodeGenerator->PushScope(bodyScope);
                funcInfo->SetCurrentChildScope(bodyScope);

                PreVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
                AddVarsToScope(pnodeFnc->pnodeVars, byteCodeGenerator);

                if (!pnodeFnc->HasNonSimpleParameterList() || funcInfo->IsBodyAndParamScopeMerged())
                {
                    VisitNestedScopes(containerScope, pnodeFnc, byteCodeGenerator, prefix, postfix, &i);
                    MapFormals(pnodeFnc, [&](ParseNode *argNode) { Visit(argNode, byteCodeGenerator, prefix, postfix); });
                }

                if (pnodeFnc->HasNonSimpleParameterList())
                {
                    byteCodeGenerator->AssignUndefinedConstRegister();

                    if (!funcInfo->IsBodyAndParamScopeMerged())
                    {
                        Assert(pnodeFnc->pnodeBodyScope->scope);
                        VisitNestedScopes(pnodeFnc->pnodeBodyScope->pnodeScopes, pnodeFnc, byteCodeGenerator, prefix, postfix, &i);
                    }
                }

                BeginVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);

                ParseNode* pnode = pnodeFnc->pnodeBody;
                while (pnode->nop == knopList)
                {
                    // Check to see whether initializations of locals to "undef" can be skipped.
                    // The logic to do this is cheap - omit the init if we see an init with a value
                    // on the RHS at the top statement level (i.e., not inside a block, try, loop, etc.)
                    // before we see a use. The motivation is to help identify single-def locals in the BE.
                    // Note that this can't be done for globals.
                    byteCodeGenerator->SetCurrentTopStatement(pnode->AsParseNodeBin()->pnode1);
                    Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
                    if (!funcInfo->GetCallsEval() && !funcInfo->GetChildCallsEval() &&
                        // So that it will not be marked as init thus it will be added to the diagnostics symbols container.
                        !(byteCodeGenerator->ShouldTrackDebuggerMetadata()))
                    {
                        MarkInit(pnode->AsParseNodeBin()->pnode1);
                    }
                    pnode = pnode->AsParseNodeBin()->pnode2;
                }
                byteCodeGenerator->SetCurrentTopStatement(pnode);
                Visit(pnode, byteCodeGenerator, prefix, postfix);

                EndVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
                EndVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
            }

            if (!pnodeFnc->pnodeBody)
            {
                // For defer prase scenario push the scopes here
                byteCodeGenerator->PushScope(funcInfo->GetParamScope());
                byteCodeGenerator->PushScope(funcInfo->GetBodyScope());
            }

            if (!parentFuncInfo->IsFakeGlobalFunction(byteCodeGenerator->GetFlags()))
            {
                pnodeFnc->nestedIndex = *pIndex;
                parentFunc->SetNestedFunc(funcInfo->byteCodeFunction->GetFunctionInfo(), (*pIndex)++, byteCodeGenerator->GetFlags());
            }

            Assert(parentFunc);

            parentFuncInfo->OnEndVisitFunction(pnodeFnc);

            PostVisitFunction(pnodeFnc, byteCodeGenerator);

            pnodeScope = pnodeFnc->pnodeNext;

            byteCodeGenerator->pCurrentFunction = pLastReuseFunc;
            break;
        }

        case knopBlock:
        {
            ParseNodeBlock * pnodeBlockScope = pnodeScope->AsParseNodeBlock();
            PreVisitBlock(pnodeBlockScope, byteCodeGenerator);
            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeBlockScope->scope, &isMergedScope);
            VisitNestedScopes(pnodeBlockScope->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);
            parentFuncInfo->OnEndVisitScope(pnodeBlockScope->scope, isMergedScope);
            PostVisitBlock(pnodeBlockScope, byteCodeGenerator);

            pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
            break;
        }

        case knopCatch:
        {
            ParseNodeCatch * pnodeCatchScope = pnodeScope->AsParseNodeCatch();
            PreVisitCatch(pnodeCatchScope, byteCodeGenerator);

            if (pnodeCatchScope->HasParam() && !pnodeCatchScope->HasPatternParam())
            {
                Visit(pnodeCatchScope->GetParam(), byteCodeGenerator, prefix, postfix);
            }

            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeCatchScope->scope, &isMergedScope);
            VisitNestedScopes(pnodeCatchScope->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);

            parentFuncInfo->OnEndVisitScope(pnodeCatchScope->scope, isMergedScope);
            PostVisitCatch(pnodeCatchScope, byteCodeGenerator);

            pnodeScope = pnodeCatchScope->pnodeNext;
            break;
        }

        case knopWith:
        {
            PreVisitWith(pnodeScope, byteCodeGenerator);
            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeScope->AsParseNodeWith()->scope, &isMergedScope);
            VisitNestedScopes(pnodeScope->AsParseNodeWith()->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);
            parentFuncInfo->OnEndVisitScope(pnodeScope->AsParseNodeWith()->scope, isMergedScope);
            PostVisitWith(pnodeScope, byteCodeGenerator);
            pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
            break;
        }

        default:
            AssertMsg(false, "Unexpected opcode in tree of scopes");
            return;
        }
    }
}